

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

void init_top(mstate m,mchunkptr p,size_t psize)

{
  ulong uVar1;
  
  uVar1 = (ulong)(-(int)p - 0x10U & 0xf);
  m->top = (mchunkptr)((long)&p->prev_foot + uVar1);
  m->topsize = psize - uVar1;
  *(size_t *)((long)&p->head + uVar1) = psize - uVar1 | 1;
  *(undefined8 *)((long)&p->head + psize) = 0x50;
  m->trim_check = mparams.trim_threshold;
  return;
}

Assistant:

static void init_top(mstate m, mchunkptr p, size_t psize) {
  /* Ensure alignment */
  size_t offset = align_offset(chunk2mem(p));
  p = (mchunkptr)((char*)p + offset);
  psize -= offset;

  m->top = p;
  m->topsize = psize;
  p->head = psize | PINUSE_BIT;
  /* set size of fake trailing chunk holding overhead space only once */
  chunk_plus_offset(p, psize)->head = TOP_FOOT_SIZE;
  m->trim_check = mparams.trim_threshold; /* reset on each update */
}